

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

string * __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_temp<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>>
          (string *__return_storage_ptr__,writer_base<cppwinrt::writer> *this,string_view *value,
          variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
          *args)

{
  uint32_t uVar1;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  allocator local_32;
  undefined1 local_31;
  size_type local_30;
  size_type size;
  variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
  *args_local;
  string_view *value_local;
  writer_base<cppwinrt::writer> *this_local;
  string *result;
  
  size = (size_type)args;
  args_local = (variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                *)value;
  value_local = (string_view *)this;
  this_local = (writer_base<cppwinrt::writer> *)__return_storage_ptr__;
  local_30 = std::vector<char,_std::allocator<char>_>::size(&this->m_first);
  uVar1 = count_placeholders((string_view *)args_local);
  if (uVar1 != 1) {
    __assert_fail("count_placeholders(value) == sizeof...(Args)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x32,
                  "std::string cppwinrt::writer_base<cppwinrt::writer>::write_temp(const std::string_view &, const Args &...) [T = cppwinrt::writer, Args = <std::variant<winmd::reader::ElementType, winmd::reader::coded_index<winmd::reader::TypeDefOrRef>, winmd::reader::GenericTypeIndex, winmd::reader::GenericTypeInstSig, winmd::reader::GenericMethodTypeIndex>>]"
                 );
  }
  write_segment<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>>
            (this,(string_view *)args_local,
             (variant<winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
              *)size);
  local_31 = 0;
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->m_first);
  pcVar2 = pcVar2 + local_30;
  sVar3 = std::vector<char,_std::allocator<char>_>::size(&this->m_first);
  uVar4 = sVar3 - local_30;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar4,&local_32);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_32);
  std::vector<char,_std::allocator<char>_>::resize(&this->m_first,local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string write_temp(std::string_view const& value, Args const&... args)
        {
#if defined(_DEBUG)
            bool restore_debug_trace = debug_trace;
            debug_trace = false;
#endif
            auto const size = m_first.size();

            assert(count_placeholders(value) == sizeof...(Args));
            write_segment(value, args...);

            std::string result{ m_first.data() + size, m_first.size() - size };
            m_first.resize(size);

#if defined(_DEBUG)
            debug_trace = restore_debug_trace;
#endif
            return result;
        }